

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O0

string * __thiscall
vkt::ssbo::(anonymous_namespace)::genName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char first,char last,int ndx)

{
  undefined7 in_register_00000009;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined8 local_50;
  undefined8 local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined8 local_38;
  int local_30;
  int alphabetLen;
  allocator<char> local_1a;
  undefined1 local_19;
  int local_18;
  char local_12;
  char local_11;
  int ndx_local;
  char last_local;
  char first_local;
  string *str;
  
  local_11 = (char)this;
  local_18 = (int)CONCAT71(in_register_00000009,last);
  local_19 = 0;
  local_12 = first;
  _ndx_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  local_30 = ((int)local_12 - (int)local_11) + 1;
  for (; local_30 < local_18; local_18 = (local_18 + -1) / local_30) {
    local_40._M_current = (char *)std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_38,&local_40);
    local_48 = std::__cxx11::string::insert
                         (__return_storage_ptr__,local_38,
                          (int)(char)(local_11 + (char)((local_18 + -1) % local_30)));
  }
  local_58._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_50,&local_58);
  std::__cxx11::string::insert
            (__return_storage_ptr__,local_50,
             (int)(char)(local_11 + -1 + (char)(local_18 % (local_30 + 1))));
  return __return_storage_ptr__;
}

Assistant:

static std::string genName (char first, char last, int ndx)
{
	std::string	str			= "";
	int			alphabetLen	= last - first + 1;

	while (ndx > alphabetLen)
	{
		str.insert(str.begin(), (char)(first + ((ndx-1)%alphabetLen)));
		ndx = ((ndx-1) / alphabetLen);
	}

	str.insert(str.begin(), (char)(first + (ndx%(alphabetLen+1)) - 1));

	return str;
}